

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

int ikcp_input(ikcpcb *kcp,char *data,long size)

{
  uint uVar1;
  int iVar2;
  IKCPSEG *newseg;
  IUINT32 mss;
  IKCPSEG *seg;
  IUINT32 local_100;
  IUINT8 frg;
  IUINT8 cmd;
  IUINT16 wnd;
  IUINT32 conv;
  IUINT32 una_1;
  IUINT32 len;
  IUINT32 sn;
  IUINT32 ts;
  int flag;
  IUINT32 maxack;
  IUINT32 una;
  long size_local;
  char *data_local;
  ikcpcb *kcp_local;
  int local_b8;
  IUINT32 local_b4;
  int local_b0;
  IUINT32 local_ac;
  IUINT32 local_a8;
  int local_a4;
  IUINT32 local_a0;
  IUINT32 local_9c;
  IUINT32 local_98;
  int local_94;
  IUINT32 local_90;
  int local_8c;
  IUINT32 *local_88;
  long local_80;
  IUINT8 *local_78;
  uint *local_70;
  IUINT32 *local_68;
  IUINT32 *local_60;
  IUINT32 *local_58;
  IUINT32 *local_50;
  IUINT32 *local_48;
  byte *local_40;
  long local_38;
  ushort *local_30;
  long local_28;
  byte *local_20;
  long local_18;
  IUINT32 *local_10;
  
  flag = kcp->snd_una;
  ts = 0;
  sn = 0;
  _maxack = size;
  size_local = (long)data;
  data_local = (char *)kcp;
  iVar2 = ikcp_canlog(kcp,2);
  if (iVar2 != 0) {
    ikcp_log((ikcpcb *)data_local,2,"[RI] %d bytes",_maxack);
  }
  if ((size_local == 0) || ((int)_maxack < 0x18)) {
    kcp_local._4_4_ = -1;
  }
  else {
    for (; 0x17 < _maxack; _maxack = _maxack - (ulong)conv) {
      local_48 = &local_100;
      local_100 = *(IUINT32 *)size_local;
      local_40 = (byte *)(size_local + 4);
      if (local_100 != *(IUINT32 *)data_local) {
        return -1;
      }
      local_28 = (long)&seg + 5;
      local_20 = (byte *)(size_local + 5);
      seg._5_1_ = *local_40;
      local_38 = (long)&seg + 4;
      local_30 = (ushort *)(size_local + 6);
      seg._4_1_ = *local_20;
      local_18 = (long)&seg + 6;
      seg._6_2_ = *local_30;
      local_10 = (IUINT32 *)(size_local + 8);
      local_58 = &len;
      len = *local_10;
      local_50 = (IUINT32 *)(size_local + 0xc);
      local_68 = &una_1;
      una_1 = *local_50;
      local_60 = (IUINT32 *)(size_local + 0x10);
      local_78 = &frg;
      _frg = *local_60;
      local_70 = (uint *)(size_local + 0x14);
      local_88 = &conv;
      conv = *local_70;
      size_local = size_local + 0x18;
      _maxack = _maxack + -0x18;
      if (_maxack < (long)(ulong)conv) {
        return -2;
      }
      if ((((seg._5_1_ != 0x51) && (seg._5_1_ != 0x52)) && (seg._5_1_ != 0x53)) &&
         (seg._5_1_ != 0x54)) {
        return -3;
      }
      *(uint *)(data_local + 0x40) = (uint)seg._6_2_;
      local_80 = size_local;
      ikcp_parse_una((ikcpcb *)data_local,_frg);
      ikcp_shrink_buf((ikcpcb *)data_local);
      if (seg._5_1_ == 0x52) {
        local_8c = *(int *)(data_local + 0x4c);
        local_90 = len;
        if (-1 < (int)(local_8c - len)) {
          local_94 = *(int *)(data_local + 0x4c);
          local_98 = len;
          ikcp_update_ack((ikcpcb *)data_local,local_94 - len);
        }
        ikcp_parse_ack((ikcpcb *)data_local,una_1);
        ikcp_shrink_buf((ikcpcb *)data_local);
        if (sn == 0) {
          sn = 1;
          ts = una_1;
        }
        else {
          local_9c = una_1;
          local_a0 = ts;
          if (0 < (int)(una_1 - ts)) {
            ts = una_1;
          }
        }
        iVar2 = ikcp_canlog((ikcpcb *)data_local,0x20);
        if (iVar2 != 0) {
          local_a4 = *(int *)(data_local + 0x4c);
          local_a8 = len;
          ikcp_log((ikcpcb *)data_local,0x10,"input ack: sn=%lu rtt=%ld rto=%ld",(ulong)una_1,
                   (long)(int)(local_a4 - len),(long)*(int *)(data_local + 0x30));
        }
      }
      else if (seg._5_1_ == 0x51) {
        iVar2 = ikcp_canlog((ikcpcb *)data_local,0x10);
        if (iVar2 != 0) {
          ikcp_log((ikcpcb *)data_local,0x10,"input psh: sn=%lu ts=%lu",(ulong)una_1,(ulong)len);
        }
        local_b0 = *(int *)(data_local + 0x18) + *(int *)(data_local + 0x3c);
        local_ac = una_1;
        if ((int)(una_1 - local_b0) < 0) {
          ikcp_ack_push((ikcpcb *)data_local,una_1,len);
          local_b8 = *(int *)(data_local + 0x18);
          local_b4 = una_1;
          if (-1 < (int)(una_1 - local_b8)) {
            newseg = ikcp_segment_new((ikcpcb *)data_local,conv);
            newseg->conv = local_100;
            newseg->cmd = (uint)seg._5_1_;
            newseg->frg = (uint)seg._4_1_;
            newseg->wnd = (uint)seg._6_2_;
            newseg->ts = len;
            newseg->sn = una_1;
            newseg->una = _frg;
            newseg->len = conv;
            if (conv != 0) {
              memcpy(newseg->data,(void *)size_local,(ulong)conv);
            }
            ikcp_parse_data((ikcpcb *)data_local,newseg);
          }
        }
      }
      else if (seg._5_1_ == 0x53) {
        *(uint *)(data_local + 0x48) = *(uint *)(data_local + 0x48) | 2;
        iVar2 = ikcp_canlog((ikcpcb *)data_local,0x40);
        if (iVar2 != 0) {
          ikcp_log((ikcpcb *)data_local,0x40,"input probe");
        }
      }
      else {
        if (seg._5_1_ != 0x54) {
          return -3;
        }
        iVar2 = ikcp_canlog((ikcpcb *)data_local,0x80);
        if (iVar2 != 0) {
          ikcp_log((ikcpcb *)data_local,0x80,"input wins: %lu",(ulong)seg._6_2_);
        }
      }
      size_local = size_local + (ulong)conv;
    }
    if (sn != 0) {
      ikcp_parse_fastack((ikcpcb *)data_local,ts);
    }
    if ((0 < *(int *)(data_local + 0x10) - flag) &&
       (*(uint *)(data_local + 0x44) < *(uint *)(data_local + 0x40))) {
      uVar1 = *(uint *)(data_local + 8);
      if (*(uint *)(data_local + 0x44) < *(uint *)(data_local + 0x24)) {
        *(int *)(data_local + 0x44) = *(int *)(data_local + 0x44) + 1;
        *(uint *)(data_local + 0x80) = uVar1 + *(int *)(data_local + 0x80);
      }
      else {
        if (*(uint *)(data_local + 0x80) < uVar1) {
          *(uint *)(data_local + 0x80) = uVar1;
        }
        *(uint *)(data_local + 0x80) =
             (uVar1 * uVar1) / *(uint *)(data_local + 0x80) + (uVar1 >> 4) +
             *(int *)(data_local + 0x80);
        if ((*(int *)(data_local + 0x44) + 1) * uVar1 <= *(uint *)(data_local + 0x80)) {
          *(int *)(data_local + 0x44) = *(int *)(data_local + 0x44) + 1;
        }
      }
      if (*(uint *)(data_local + 0x40) < *(uint *)(data_local + 0x44)) {
        *(undefined4 *)(data_local + 0x44) = *(undefined4 *)(data_local + 0x40);
        *(uint *)(data_local + 0x80) = *(int *)(data_local + 0x40) * uVar1;
      }
    }
    kcp_local._4_4_ = 0;
  }
  return kcp_local._4_4_;
}

Assistant:

int ikcp_input(ikcpcb *kcp, const char *data, long size)
{
	IUINT32 una = kcp->snd_una;
	IUINT32 maxack = 0;
	int flag = 0;

	if (ikcp_canlog(kcp, IKCP_LOG_INPUT)) {
		ikcp_log(kcp, IKCP_LOG_INPUT, "[RI] %d bytes", size);
	}

	if (data == NULL || (int)size < (int)IKCP_OVERHEAD) return -1;

	while (1) {
		IUINT32 ts, sn, len, una, conv;
		IUINT16 wnd;
		IUINT8 cmd, frg;
		IKCPSEG *seg;

		if (size < (int)IKCP_OVERHEAD) break;

		data = ikcp_decode32u(data, &conv);
		if (conv != kcp->conv) return -1;

		data = ikcp_decode8u(data, &cmd);
		data = ikcp_decode8u(data, &frg);
		data = ikcp_decode16u(data, &wnd);
		data = ikcp_decode32u(data, &ts);
		data = ikcp_decode32u(data, &sn);
		data = ikcp_decode32u(data, &una);
		data = ikcp_decode32u(data, &len);

		size -= IKCP_OVERHEAD;

		if ((long)size < (long)len) return -2;

		if (cmd != IKCP_CMD_PUSH && cmd != IKCP_CMD_ACK &&
			cmd != IKCP_CMD_WASK && cmd != IKCP_CMD_WINS) 
			return -3;

		kcp->rmt_wnd = wnd;
		ikcp_parse_una(kcp, una);
		ikcp_shrink_buf(kcp);

		if (cmd == IKCP_CMD_ACK) {
			if (_itimediff(kcp->current, ts) >= 0) {
				ikcp_update_ack(kcp, _itimediff(kcp->current, ts));
			}
			ikcp_parse_ack(kcp, sn);
			ikcp_shrink_buf(kcp);
			if (flag == 0) {
				flag = 1;
				maxack = sn;
			}	else {
				if (_itimediff(sn, maxack) > 0) {
					maxack = sn;
				}
			}
			if (ikcp_canlog(kcp, IKCP_LOG_IN_ACK)) {
				ikcp_log(kcp, IKCP_LOG_IN_DATA, 
					"input ack: sn=%lu rtt=%ld rto=%ld", sn, 
					(long)_itimediff(kcp->current, ts),
					(long)kcp->rx_rto);
			}
		}
		else if (cmd == IKCP_CMD_PUSH) {
			if (ikcp_canlog(kcp, IKCP_LOG_IN_DATA)) {
				ikcp_log(kcp, IKCP_LOG_IN_DATA, 
					"input psh: sn=%lu ts=%lu", sn, ts);
			}
			if (_itimediff(sn, kcp->rcv_nxt + kcp->rcv_wnd) < 0) {
				ikcp_ack_push(kcp, sn, ts);
				if (_itimediff(sn, kcp->rcv_nxt) >= 0) {
					seg = ikcp_segment_new(kcp, len);
					seg->conv = conv;
					seg->cmd = cmd;
					seg->frg = frg;
					seg->wnd = wnd;
					seg->ts = ts;
					seg->sn = sn;
					seg->una = una;
					seg->len = len;

					if (len > 0) {
						memcpy(seg->data, data, len);
					}

					ikcp_parse_data(kcp, seg);
				}
			}
		}
		else if (cmd == IKCP_CMD_WASK) {
			// ready to send back IKCP_CMD_WINS in ikcp_flush
			// tell remote my window size
			kcp->probe |= IKCP_ASK_TELL;
			if (ikcp_canlog(kcp, IKCP_LOG_IN_PROBE)) {
				ikcp_log(kcp, IKCP_LOG_IN_PROBE, "input probe");
			}
		}
		else if (cmd == IKCP_CMD_WINS) {
			// do nothing
			if (ikcp_canlog(kcp, IKCP_LOG_IN_WINS)) {
				ikcp_log(kcp, IKCP_LOG_IN_WINS,
					"input wins: %lu", (IUINT32)(wnd));
			}
		}
		else {
			return -3;
		}

		data += len;
		size -= len;
	}

	if (flag != 0) {
		ikcp_parse_fastack(kcp, maxack);
	}

	if (_itimediff(kcp->snd_una, una) > 0) {
		if (kcp->cwnd < kcp->rmt_wnd) {
			IUINT32 mss = kcp->mss;
			if (kcp->cwnd < kcp->ssthresh) {
				kcp->cwnd++;
				kcp->incr += mss;
			}	else {
				if (kcp->incr < mss) kcp->incr = mss;
				kcp->incr += (mss * mss) / kcp->incr + (mss / 16);
				if ((kcp->cwnd + 1) * mss <= kcp->incr) {
					kcp->cwnd++;
				}
			}
			if (kcp->cwnd > kcp->rmt_wnd) {
				kcp->cwnd = kcp->rmt_wnd;
				kcp->incr = kcp->rmt_wnd * mss;
			}
		}
	}

	return 0;
}